

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O0

void __thiscall YAML::Scanner::ScanToNextToken(Scanner *this)

{
  bool bVar1;
  char ch;
  byte bVar2;
  Scanner *in_RDI;
  int n;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  Stream *in_stack_ffffffffffffffb0;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 uVar3;
  
  while( true ) {
    while( true ) {
      bVar1 = YAML::Stream::operator_cast_to_bool(&in_RDI->INPUT);
      uVar3 = false;
      if (bVar1) {
        ch = YAML::Stream::peek((Stream *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        uVar3 = IsWhitespaceToBeEaten(in_RDI,ch);
      }
      if ((bool)uVar3 == false) break;
      bVar1 = InBlockContext((Scanner *)0xf162ad);
      if (bVar1) {
        Exp::Tab();
        bVar1 = RegEx::Matches((RegEx *)in_stack_ffffffffffffffb0,
                               (Stream *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        if (bVar1) {
          in_RDI->m_simpleKeyAllowed = false;
        }
      }
      YAML::Stream::eat(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    in_stack_ffffffffffffffb0 = (Stream *)&stack0xffffffffffffffd8;
    Exp::Comment();
    bVar2 = RegEx::Matches((RegEx *)in_stack_ffffffffffffffb0,
                           (Stream *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    RegEx::~RegEx((RegEx *)0xf16319);
    if ((bVar2 & 1) != 0) {
      while( true ) {
        bVar1 = YAML::Stream::operator_cast_to_bool(&in_RDI->INPUT);
        in_stack_ffffffffffffffac = in_stack_ffffffffffffffac & 0xffffff;
        if (bVar1) {
          Exp::Break();
          bVar1 = RegEx::Matches((RegEx *)in_stack_ffffffffffffffb0,
                                 (Stream *)
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          in_stack_ffffffffffffffac = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffac) ^ 0xff000000;
        }
        if ((in_stack_ffffffffffffffac & 0x1000000) == 0) break;
        YAML::Stream::eat(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      }
    }
    Exp::Break();
    bVar1 = RegEx::Matches((RegEx *)in_stack_ffffffffffffffb0,
                           (Stream *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (!bVar1) break;
    Exp::Break();
    RegEx::Match((RegEx *)in_RDI,(Stream *)CONCAT17(uVar3,CONCAT16(bVar2,in_stack_ffffffffffffffb8))
                );
    YAML::Stream::eat(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    InvalidateSimpleKey(in_RDI);
    bVar1 = InBlockContext((Scanner *)0xf163dd);
    if (bVar1) {
      in_RDI->m_simpleKeyAllowed = true;
    }
  }
  return;
}

Assistant:

void Scanner::ScanToNextToken() {
  while (true) {
    // first eat whitespace
    while (INPUT && IsWhitespaceToBeEaten(INPUT.peek())) {
      if (InBlockContext() && Exp::Tab().Matches(INPUT)) {
        m_simpleKeyAllowed = false;
      }
      INPUT.eat(1);
    }

    // then eat a comment
    if (Exp::Comment().Matches(INPUT)) {
      // eat until line break
      while (INPUT && !Exp::Break().Matches(INPUT)) {
        INPUT.eat(1);
      }
    }

    // if it's NOT a line break, then we're done!
    if (!Exp::Break().Matches(INPUT)) {
      break;
    }

    // otherwise, let's eat the line break and keep going
    int n = Exp::Break().Match(INPUT);
    INPUT.eat(n);

    // oh yeah, and let's get rid of that simple key
    InvalidateSimpleKey();

    // new line - we may be able to accept a simple key now
    if (InBlockContext()) {
      m_simpleKeyAllowed = true;
    }
  }
}